

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O3

void show_equip(wchar_t mode,item_tester tester)

{
  object **list;
  long lVar1;
  ulong uVar2;
  wchar_t last;
  ulong uVar3;
  
  wipe_obj_list();
  build_obj_list((uint)(player->body).count + L'\xffffffff',(object **)0x0,tester,mode);
  if ((mode & 1U) != 0) {
    strnfmt(items[num_obj].label,0x50,"In quiver");
    lVar1 = (long)num_obj;
    num_obj = num_obj + L'\x01';
    items[lVar1].object = (object *)0x0;
    list = player->upkeep->quiver;
    uVar3 = 0xffffffff;
    last = L'\xffffffff';
    if ((ulong)z_info->quiver_size != 0) {
      uVar2 = 0;
      do {
        if (list[uVar2] != (object *)0x0) {
          uVar3 = uVar2 & 0xffffffff;
        }
        last = (wchar_t)uVar3;
        uVar2 = uVar2 + 1;
      } while (z_info->quiver_size != uVar2);
    }
    build_obj_list(last,list,tester,mode);
  }
  num_head = L'\0';
  show_obj_list(mode);
  return;
}

Assistant:

void show_equip(int mode, item_tester tester)
{
	int i;
	bool in_term = (mode & OLIST_WINDOW) ? true : false;

	/* Initialize */
	wipe_obj_list();

	/* Build the object list */
	build_obj_list(player->body.count - 1, NULL, tester, mode);

	/* Show the quiver in subwindows */
	if (in_term) {
		int last_slot = -1;

		strnfmt(items[num_obj].label, sizeof(items[num_obj].label),
				"In quiver");
		items[num_obj].object = NULL;
		num_obj++;

		/* Find the last occupied quiver slot */
		for (i = 0; i < z_info->quiver_size; i++)
			if (player->upkeep->quiver[i] != NULL) last_slot = i;

		/* Extend the object list */
		build_obj_list(last_slot, player->upkeep->quiver, tester, mode);
	}

	/* Display the object list */
	num_head = 0;
	show_obj_list(mode);
}